

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::dropEvent(QListView *this,QDropEvent *event)

{
  long *plVar1;
  int *piVar2;
  char cVar3;
  DragDropMode DVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  QListView *pQVar8;
  iterator iVar9;
  iterator iVar10;
  ulong uVar11;
  QAbstractItemModel *pQVar12;
  QModelIndex *index;
  QModelIndex *pQVar13;
  long lVar14;
  bool bVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  QPersistentModelIndex dropRow;
  int row;
  int col;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QModelIndex local_b8;
  QPersistentModelIndex local_a0;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  int local_60;
  undefined4 local_5c;
  undefined8 local_58;
  quintptr qStack_50;
  QAbstractItemModel *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
  if (*(int *)(event + 0x2c) == 2) {
    bVar16 = false;
  }
  else {
    DVar4 = QAbstractItemView::dragDropMode((QAbstractItemView *)this);
    bVar16 = DVar4 != InternalMove;
  }
  pQVar8 = (QListView *)QDropEvent::source();
  if ((bVar16) || (pQVar8 != this)) goto LAB_00575f66;
  local_58 = -1;
  qStack_50 = 0;
  local_48 = (QAbstractItemModel *)0x0;
  local_5c = 0xffffffff;
  local_60 = -1;
  if ((event[0xc] == (QDropEvent)0x0) &&
     (cVar3 = (**(code **)(*plVar1 + 0x110))(plVar1,event,&local_60,&local_5c,&local_58),
     cVar3 != '\0')) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x2d8))(&local_78,this);
    local_98.d = (Data *)0x0;
    local_98.ptr = (QPersistentModelIndex *)0x0;
    local_98.size = 0;
    QList<QPersistentModelIndex>::reserve
              ((QList<QPersistentModelIndex> *)&local_98,(qsizetype)local_68);
    if (local_68 == (undefined1 *)0x0) {
LAB_00575d25:
      if ((((int)local_58 < 0) || (local_58 < 0)) || (local_48 == (QAbstractItemModel *)0x0)) {
        iVar9 = QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)&local_98);
        iVar10 = QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
        if (iVar9.i != iVar10.i) {
          uVar11 = (long)iVar10.i - (long)iVar9.i >> 3;
          lVar14 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QPersistentModelIndex>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar9.i,iVar10.i,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar9.i,iVar10.i);
        }
        local_a0.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar12 = QAbstractItemView::model((QAbstractItemView *)this);
        (**(code **)(*(long *)pQVar12 + 0x60))(&local_b8,pQVar12,local_60,local_5c,&local_58);
        QPersistentModelIndex::QPersistentModelIndex(&local_a0,&local_b8);
        if (local_60 == -1) {
          pQVar12 = QAbstractItemView::model((QAbstractItemView *)this);
          local_b8.r = -1;
          local_b8.c = -1;
          local_b8.i = 0;
          local_b8.m.ptr = (QAbstractItemModel *)0x0;
          iVar6 = (**(code **)(*(long *)pQVar12 + 0x78))(pQVar12);
        }
        else {
          iVar5 = QPersistentModelIndex::row();
          iVar6 = local_60;
          if (-1 < iVar5) {
            iVar6 = QPersistentModelIndex::row();
          }
        }
        if (local_98.size != 0) {
          lVar14 = local_98.size << 3;
          bVar15 = false;
          do {
            iVar5 = QPersistentModelIndex::row();
            if ((iVar6 == iVar5) || (iVar5 = QPersistentModelIndex::row(), iVar6 == iVar5 + 1)) {
LAB_00575eec:
              bVar15 = true;
              iVar6 = QPersistentModelIndex::row();
              iVar6 = iVar6 + 1;
            }
            else {
              pQVar12 = QAbstractItemView::model((QAbstractItemView *)this);
              local_b8.r = -1;
              local_b8.c = -1;
              local_b8.i = 0;
              local_b8.m.ptr = (QAbstractItemModel *)0x0;
              uVar7 = QPersistentModelIndex::row();
              local_d0 = 0xffffffffffffffff;
              local_c8 = 0;
              uStack_c0 = 0;
              cVar3 = (**(code **)(*(long *)pQVar12 + 0x118))
                                (pQVar12,&local_b8,uVar7,1,&local_d0,iVar6);
              if (cVar3 != '\0') goto LAB_00575eec;
            }
            lVar14 = lVar14 + -8;
          } while (lVar14 != 0);
          if (bVar15) {
            event[0xc] = (QDropEvent)0x1;
          }
        }
        QPersistentModelIndex::~QPersistentModelIndex(&local_a0);
      }
    }
    else {
      pQVar13 = (QModelIndex *)CONCAT44(uStack_6c,uStack_70);
      lVar14 = (long)local_68 * 0x18;
      bVar15 = false;
      do {
        lVar14 = lVar14 + -0x18;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8,pQVar13);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_98,local_98.size,
                   (QPersistentModelIndex *)&local_b8);
        QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
        if (((pQVar13->r == (int)local_58) && (pQVar13->c == local_58._4_4_)) &&
           (pQVar13->i == qStack_50)) {
          bVar17 = (pQVar13->m).ptr == local_48;
        }
        else {
          bVar17 = false;
        }
        if (bVar17) {
          bVar15 = true;
          break;
        }
        pQVar13 = pQVar13 + 1;
      } while (lVar14 != 0);
      if (!bVar15) goto LAB_00575d25;
    }
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
    piVar2 = (int *)CONCAT44(uStack_74,local_78);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x18,0x10);
      }
    }
  }
  if (event[0xc] == (QDropEvent)0x1) {
    *(undefined1 *)((long)plVar1 + 0x3e5) = 1;
  }
LAB_00575f66:
  cVar3 = (**(code **)(*(long *)plVar1[0xa8] + 0xb8))((long *)plVar1[0xa8],event);
  if ((cVar3 == '\0') || (*(char *)((long)plVar1 + 0x3e5) == '\0')) {
    if (!bVar16 && *(char *)((long)plVar1 + 0x3e5) == '\0') {
      event[0xc] = (QDropEvent)0x0;
    }
    QAbstractItemView::dropEvent((QAbstractItemView *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::dropEvent(QDropEvent *event)
{
    Q_D(QListView);

    const bool moveAction = event->dropAction() == Qt::MoveAction
                         || dragDropMode() == QAbstractItemView::InternalMove;
    if (event->source() == this && moveAction) {
        QModelIndex topIndex;
        bool topIndexDropped = false;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex)) {
            const QList<QModelIndex> selIndexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(selIndexes.size());

            for (const auto &index : selIndexes) {
                persIndexes.append(index);
                if (index == topIndex) {
                    topIndexDropped = true;
                    break;
                }
            }

            if (!topIndexDropped && !topIndex.isValid()) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved)
                    event->accept();
            }
        }

        // either we or a subclass accepted the move event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    if (!d->commonListView->filterDropEvent(event) || !d->dropEventMoved) {
        // icon view didn't move the data, and moveRows not implemented, so fall back to default
        if (!d->dropEventMoved && moveAction)
            event->ignore();
        QAbstractItemView::dropEvent(event);
    }
}